

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx2::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t primID,BBox1f *time_range)

{
  float fVar1;
  float fVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  size_t *psVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar18 = (this->super_LineSegments).super_Geometry.time_range.lower;
  fVar32 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar18;
  fVar21 = (time_range->lower - fVar18) / fVar32;
  fVar32 = (time_range->upper - fVar18) / fVar32;
  fVar18 = fVar1 * fVar21;
  fVar36 = fVar1 * fVar32;
  auVar27 = vroundss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),9);
  auVar26 = vroundss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),10);
  auVar38 = ZEXT816(0) << 0x40;
  auVar34 = vmaxss_avx(auVar27,auVar38);
  auVar29 = vminss_avx(auVar26,ZEXT416((uint)fVar1));
  fVar44 = auVar34._0_4_;
  fVar40 = auVar29._0_4_;
  iVar9 = -1;
  if (-1 < (int)auVar27._0_4_) {
    iVar9 = (int)auVar27._0_4_;
  }
  uVar8 = (int)fVar1 + 1U;
  if ((int)auVar26._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar8 = (int)auVar26._0_4_;
  }
  lVar13 = (long)(int)fVar44;
  uVar10 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                    primID * *(long *)&(this->super_LineSegments).field_0x68);
  uVar11 = (ulong)uVar10;
  pBVar3 = (this->super_LineSegments).vertices.items;
  pcVar4 = pBVar3[lVar13].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[lVar13].super_RawBufferView.stride;
  lVar17 = sVar5 * uVar11;
  uVar14 = (ulong)(uVar10 + 1);
  lVar15 = sVar5 * uVar14;
  auVar27 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                       *(undefined1 (*) [16])(pcVar4 + lVar15));
  auVar34 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                       *(undefined1 (*) [16])(pcVar4 + lVar15));
  fVar2 = (this->super_LineSegments).maxRadiusScale;
  auVar29 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar15 + 0xc)),
                       ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)));
  fVar6 = fVar2 * auVar29._0_4_;
  auVar29._4_4_ = fVar6;
  auVar29._0_4_ = fVar6;
  auVar29._8_4_ = fVar6;
  auVar29._12_4_ = fVar6;
  auVar26 = vsubps_avx(auVar27,auVar29);
  auVar23._0_4_ = auVar34._0_4_ + fVar6;
  auVar23._4_4_ = auVar34._4_4_ + fVar6;
  auVar23._8_4_ = auVar34._8_4_ + fVar6;
  auVar23._12_4_ = auVar34._12_4_ + fVar6;
  lVar17 = (long)(int)fVar40;
  pcVar4 = pBVar3[lVar17].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[lVar17].super_RawBufferView.stride;
  lVar16 = sVar5 * uVar11;
  lVar15 = sVar5 * uVar14;
  auVar27 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar16),
                       *(undefined1 (*) [16])(pcVar4 + lVar15));
  auVar29 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar15 + 0xc)),
                       ZEXT416(*(uint *)(pcVar4 + lVar16 + 0xc)));
  auVar34 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar16),
                       *(undefined1 (*) [16])(pcVar4 + lVar15));
  fVar6 = auVar29._0_4_ * fVar2;
  auVar48._4_4_ = fVar6;
  auVar48._0_4_ = fVar6;
  auVar48._8_4_ = fVar6;
  auVar48._12_4_ = fVar6;
  auVar29 = vsubps_avx(auVar27,auVar48);
  auVar27._0_4_ = fVar6 + auVar34._0_4_;
  auVar27._4_4_ = fVar6 + auVar34._4_4_;
  auVar27._8_4_ = fVar6 + auVar34._8_4_;
  auVar27._12_4_ = fVar6 + auVar34._12_4_;
  if (uVar8 - iVar9 == 1) {
    auVar34 = vmaxss_avx(ZEXT416((uint)(fVar18 - fVar44)),auVar38);
    fVar18 = auVar34._0_4_;
    fVar1 = 1.0 - fVar18;
    auVar33._0_4_ = fVar18 * auVar29._0_4_;
    auVar33._4_4_ = fVar18 * auVar29._4_4_;
    auVar33._8_4_ = fVar18 * auVar29._8_4_;
    auVar33._12_4_ = fVar18 * auVar29._12_4_;
    auVar31._4_4_ = fVar1;
    auVar31._0_4_ = fVar1;
    auVar31._8_4_ = fVar1;
    auVar31._12_4_ = fVar1;
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar33,auVar31,auVar26);
    auVar19._0_4_ = fVar18 * auVar27._0_4_;
    auVar19._4_4_ = fVar18 * auVar27._4_4_;
    auVar19._8_4_ = fVar18 * auVar27._8_4_;
    auVar19._12_4_ = fVar18 * auVar27._12_4_;
    aVar28 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar19,auVar23,auVar31);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar30;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar28;
    auVar34 = vmaxss_avx(ZEXT416((uint)(fVar40 - fVar36)),auVar38);
    fVar18 = auVar34._0_4_;
    fVar1 = 1.0 - fVar18;
    auVar25._0_4_ = fVar18 * auVar26._0_4_;
    auVar25._4_4_ = fVar18 * auVar26._4_4_;
    auVar25._8_4_ = fVar18 * auVar26._8_4_;
    auVar25._12_4_ = fVar18 * auVar26._12_4_;
    auVar22._4_4_ = fVar1;
    auVar22._0_4_ = fVar1;
    auVar22._8_4_ = fVar1;
    auVar22._12_4_ = fVar1;
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar29,auVar22,auVar25);
    auVar20._0_4_ = fVar18 * auVar23._0_4_;
    auVar20._4_4_ = fVar18 * auVar23._4_4_;
    auVar20._8_4_ = fVar18 * auVar23._8_4_;
    auVar20._12_4_ = fVar18 * auVar23._12_4_;
    aVar28 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar27,auVar22,auVar20);
  }
  else {
    pcVar4 = pBVar3[lVar13 + 1].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[lVar13 + 1].super_RawBufferView.stride;
    lVar15 = sVar5 * uVar11;
    lVar13 = sVar5 * uVar14;
    auVar48 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar15),
                         *(undefined1 (*) [16])(pcVar4 + lVar13));
    auVar34 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar15),
                         *(undefined1 (*) [16])(pcVar4 + lVar13));
    auVar38 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar13 + 0xc)),
                         ZEXT416(*(uint *)(pcVar4 + lVar15 + 0xc)));
    fVar6 = auVar38._0_4_ * fVar2;
    auVar38._4_4_ = fVar6;
    auVar38._0_4_ = fVar6;
    auVar38._8_4_ = fVar6;
    auVar38._12_4_ = fVar6;
    auVar24 = vsubps_avx(auVar48,auVar38);
    pcVar4 = pBVar3[lVar17 + -1].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[lVar17 + -1].super_RawBufferView.stride;
    lVar17 = sVar5 * uVar11;
    lVar15 = sVar5 * uVar14;
    auVar35 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                         *(undefined1 (*) [16])(pcVar4 + lVar15));
    auVar38 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                         *(undefined1 (*) [16])(pcVar4 + lVar15));
    auVar48 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar15 + 0xc)),
                         ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)));
    fVar7 = auVar48._0_4_ * fVar2;
    auVar49._4_4_ = fVar7;
    auVar49._0_4_ = fVar7;
    auVar49._8_4_ = fVar7;
    auVar49._12_4_ = fVar7;
    auVar35 = vsubps_avx(auVar35,auVar49);
    auVar48 = vmaxss_avx(ZEXT416((uint)(fVar18 - fVar44)),ZEXT416(0));
    fVar44 = auVar48._0_4_;
    fVar18 = 1.0 - fVar44;
    auVar51._0_4_ = fVar44 * auVar24._0_4_;
    auVar51._4_4_ = fVar44 * auVar24._4_4_;
    auVar51._8_4_ = fVar44 * auVar24._8_4_;
    auVar51._12_4_ = fVar44 * auVar24._12_4_;
    auVar50._4_4_ = fVar18;
    auVar50._0_4_ = fVar18;
    auVar50._8_4_ = fVar18;
    auVar50._12_4_ = fVar18;
    auVar26 = vfmadd213ps_fma(auVar26,auVar50,auVar51);
    auVar45._0_4_ = fVar44 * (auVar34._0_4_ + fVar6);
    auVar45._4_4_ = fVar44 * (auVar34._4_4_ + fVar6);
    auVar45._8_4_ = fVar44 * (auVar34._8_4_ + fVar6);
    auVar45._12_4_ = fVar44 * (auVar34._12_4_ + fVar6);
    auVar24 = vfmadd213ps_fma(auVar23,auVar50,auVar45);
    auVar34 = vmaxss_avx(ZEXT416((uint)(fVar40 - fVar36)),ZEXT416(0));
    fVar36 = auVar34._0_4_;
    fVar18 = 1.0 - fVar36;
    auVar34._0_4_ = fVar36 * auVar35._0_4_;
    auVar34._4_4_ = fVar36 * auVar35._4_4_;
    auVar34._8_4_ = fVar36 * auVar35._8_4_;
    auVar34._12_4_ = fVar36 * auVar35._12_4_;
    auVar41._4_4_ = fVar18;
    auVar41._0_4_ = fVar18;
    auVar41._8_4_ = fVar18;
    auVar41._12_4_ = fVar18;
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar29,auVar41,auVar34);
    auVar35._0_4_ = fVar36 * (auVar38._0_4_ + fVar7);
    auVar35._4_4_ = fVar36 * (auVar38._4_4_ + fVar7);
    auVar35._8_4_ = fVar36 * (auVar38._8_4_ + fVar7);
    auVar35._12_4_ = fVar36 * (auVar38._12_4_ + fVar7);
    aVar28 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar27,auVar41,auVar35);
    uVar10 = iVar9 + 1;
    if ((int)uVar10 < (int)uVar8) {
      psVar12 = &pBVar3[uVar10].super_RawBufferView.stride;
      auVar34 = auVar24;
      auVar29 = auVar26;
      do {
        fVar37 = ((float)(int)uVar10 / fVar1 - fVar21) / (fVar32 - fVar21);
        fVar36 = 1.0 - fVar37;
        auVar46._0_4_ = fVar37 * aVar30.m128[0];
        fVar18 = aVar30.m128[1];
        auVar46._4_4_ = fVar37 * fVar18;
        fVar40 = aVar30.m128[2];
        auVar46._8_4_ = fVar37 * fVar40;
        fVar6 = aVar30.m128[3];
        auVar46._12_4_ = fVar37 * fVar6;
        auVar42._4_4_ = fVar36;
        auVar42._0_4_ = fVar36;
        auVar42._8_4_ = fVar36;
        auVar42._12_4_ = fVar36;
        auVar23 = vfmadd231ps_fma(auVar46,auVar42,auVar29);
        auVar39._0_4_ = fVar37 * aVar28.m128[0];
        fVar36 = aVar28.m128[1];
        auVar39._4_4_ = fVar37 * fVar36;
        fVar44 = aVar28.m128[2];
        auVar39._8_4_ = fVar37 * fVar44;
        fVar7 = aVar28.m128[3];
        auVar39._12_4_ = fVar37 * fVar7;
        auVar48 = vfmadd231ps_fma(auVar39,auVar34,auVar42);
        pcVar4 = ((RawBufferView *)(psVar12 + -2))->ptr_ofs;
        lVar17 = *psVar12 * uVar11;
        lVar15 = *psVar12 * uVar14;
        auVar38 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                             *(undefined1 (*) [16])(pcVar4 + lVar15));
        auVar26 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar15 + 0xc)),
                             ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)));
        auVar27 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                             *(undefined1 (*) [16])(pcVar4 + lVar15));
        fVar37 = auVar26._0_4_ * fVar2;
        auVar47._4_4_ = fVar37;
        auVar47._0_4_ = fVar37;
        auVar47._8_4_ = fVar37;
        auVar47._12_4_ = fVar37;
        auVar26 = vsubps_avx(auVar38,auVar47);
        auVar26 = vsubps_avx(auVar26,auVar23);
        auVar43._0_4_ = auVar27._0_4_ + fVar37;
        auVar43._4_4_ = auVar27._4_4_ + fVar37;
        auVar43._8_4_ = auVar27._8_4_ + fVar37;
        auVar43._12_4_ = auVar27._12_4_ + fVar37;
        auVar27 = vsubps_avx(auVar43,auVar48);
        auVar38 = vminps_avx(auVar26,ZEXT416(0) << 0x20);
        auVar27 = vmaxps_avx(auVar27,ZEXT416(0) << 0x20);
        auVar26._0_4_ = auVar38._0_4_ + auVar29._0_4_;
        auVar26._4_4_ = auVar38._4_4_ + auVar29._4_4_;
        auVar26._8_4_ = auVar38._8_4_ + auVar29._8_4_;
        auVar26._12_4_ = auVar38._12_4_ + auVar29._12_4_;
        aVar30._0_4_ = auVar38._0_4_ + aVar30.m128[0];
        aVar30._4_4_ = auVar38._4_4_ + fVar18;
        aVar30._8_4_ = auVar38._8_4_ + fVar40;
        aVar30._12_4_ = auVar38._12_4_ + fVar6;
        auVar24._0_4_ = auVar27._0_4_ + auVar34._0_4_;
        auVar24._4_4_ = auVar27._4_4_ + auVar34._4_4_;
        auVar24._8_4_ = auVar27._8_4_ + auVar34._8_4_;
        auVar24._12_4_ = auVar27._12_4_ + auVar34._12_4_;
        aVar28._0_4_ = auVar27._0_4_ + aVar28.m128[0];
        aVar28._4_4_ = auVar27._4_4_ + fVar36;
        aVar28._8_4_ = auVar27._8_4_ + fVar44;
        aVar28._12_4_ = auVar27._12_4_ + fVar7;
        uVar10 = uVar10 + 1;
        psVar12 = psVar12 + 7;
        auVar34 = auVar24;
        auVar29 = auVar26;
      } while (uVar8 != uVar10);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar26;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar24;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar30;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar28;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const {
        return linearBounds(primID,time_range);
      }